

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  RtMidi *rtmidi;
  undefined8 extraout_RAX;
  int n;
  int iVar3;
  int iVar4;
  RtMidiIn *rtmidi_00;
  allocator<char> local_71;
  RtMidiIn *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  string local_50 [32];
  
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc != 2) {
    usage();
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    _Unwind_Resume(extraout_RAX);
  }
  iVar2 = atoi(argv[1]);
  rtmidi = (RtMidi *)operator_new(0x10);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"RtMidi Output Client",&local_71);
  RtMidiOut::RtMidiOut((RtMidiOut *)rtmidi,0,local_50);
  std::__cxx11::string::~string(local_50);
  local_70 = (RtMidiIn *)operator_new(0x10);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"RtMidi Input Client",&local_71);
  rtmidi_00 = local_70;
  RtMidiIn::RtMidiIn(local_70,0,local_50,100);
  std::__cxx11::string::~string(local_50);
  (**(code **)(**(long **)(rtmidi_00 + 8) + 0x58))(*(long **)(rtmidi_00 + 8),0,1);
  bVar1 = chooseMidiPort((RtMidi *)rtmidi_00);
  if ((bVar1) && (bVar1 = chooseMidiPort(rtmidi), bVar1)) {
    RtMidiIn::setCallback(rtmidi_00,mycallback,(void *)0x0);
    local_50[0] = (string)0xf6;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&message,(uchar *)local_50);
    RtMidiOut::sendMessage((RtMidiOut *)rtmidi,&message);
    usleep(500000);
    for (iVar3 = 0; rtmidi_00 = local_70, iVar3 != 2; iVar3 = iVar3 + 1) {
      if (message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_50[0] = (string)0xf0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&message,(uchar *)local_50);
      for (iVar4 = 0; iVar2 != iVar4; iVar4 = iVar4 + 1) {
        local_50[0] = (string)((byte)iVar4 & 0x7f);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&message,(uchar *)local_50);
      }
      local_50[0] = (string)0xf7;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&message,(uchar *)local_50);
      RtMidiOut::sendMessage((RtMidiOut *)rtmidi,&message);
      usleep(500000);
    }
  }
  (**(code **)(*(long *)rtmidi + 0x40))(rtmidi);
  if (rtmidi_00 != (RtMidiIn *)0x0) {
    (**(code **)(*(long *)rtmidi_00 + 0x40))(rtmidi_00);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
  RtMidiOut *midiout = 0;
  RtMidiIn *midiin = 0;
  std::vector<unsigned char> message;
  unsigned int i, nBytes;

  // Minimal command-line check.
  if ( argc != 2 ) usage();
  nBytes = (unsigned int) atoi( argv[1] );

  // RtMidiOut and RtMidiIn constructors
  try {
    midiout = new RtMidiOut();
    midiin = new RtMidiIn();
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  // Don't ignore sysex, timing, or active sensing messages.
  midiin->ignoreTypes( false, true, true );

  try {
    if ( chooseMidiPort( midiin ) == false ) goto cleanup;
    if ( chooseMidiPort( midiout ) == false ) goto cleanup;
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  midiin->setCallback( &mycallback );

  message.push_back( 0xF6 );
  midiout->sendMessage( &message );
  SLEEP( 500 ); // pause a little

  // Create a long sysex message of numbered bytes and send it out ... twice.
  for ( int n=0; n<2; n++ ) {
    message.clear();
    message.push_back( 240 );
    for ( i=0; i<nBytes; i++ )
      message.push_back( i % 128 );
    message.push_back( 247 );
    midiout->sendMessage( &message );

    SLEEP( 500 ); // pause a little
  }

  // Clean up
 cleanup:
  delete midiout;
  delete midiin;

  return 0;
}